

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalGenerator::AddInstallComponent(cmGlobalGenerator *this,char *component)

{
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((component != (char *)0x0) && (*component != '\0')) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar1 = strlen(component);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,component,component + sVar1)
    ;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->InstallComponents,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddInstallComponent(const char* component)
{
  if(component && *component)
    {
    this->InstallComponents.insert(component);
    }
}